

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int z_inflateInit2_(z_streamp strm,int windowBits,char *version,int stream_size)

{
  int iVar1;
  code *pcVar2;
  internal_state *piVar3;
  int iVar4;
  uint uVar5;
  
  iVar1 = -6;
  if ((((version != (char *)0x0) && (stream_size == 0x58)) && (*version == '1')) &&
     (iVar1 = -2, strm != (z_streamp)0x0)) {
    strm->msg = (char *)0x0;
    pcVar2 = strm->zalloc;
    if (pcVar2 == (z_alloc_func)0x0) {
      pcVar2 = zcalloc;
      strm->zalloc = zcalloc;
      strm->opaque = (z_voidpf)0x0;
    }
    if (strm->zfree == (z_free_func)0x0) {
      strm->zfree = zcfree;
    }
    piVar3 = (internal_state *)(*pcVar2)(strm->opaque,1,0x2548);
    if (piVar3 == (internal_state *)0x0) {
      iVar1 = -4;
    }
    else {
      strm->state = piVar3;
      if (windowBits < 0) {
        iVar4 = 0;
        uVar5 = -windowBits;
      }
      else {
        iVar4 = ((uint)windowBits >> 4) + 1;
        uVar5 = windowBits & 0xf;
        if (0x2f < (uint)windowBits) {
          uVar5 = windowBits;
        }
      }
      piVar3->status = iVar4;
      if (0xfffffff7 < uVar5 - 0x10) {
        piVar3->pending = uVar5;
        piVar3->gzindex = 0;
        piVar3->method = '\0';
        *(undefined3 *)&piVar3->field_0x3d = 0;
        iVar1 = z_inflateReset(strm);
        return iVar1;
      }
      (*strm->zfree)(strm->opaque,piVar3);
      strm->state = (internal_state *)0x0;
    }
  }
  return iVar1;
}

Assistant:

int ZEXPORT inflateInit2_(strm, windowBits, version, stream_size)
z_streamp strm;
int windowBits;
const char *version;
int stream_size;
{
    struct inflate_state FAR *state;

    if (version == Z_NULL || version[0] != ZLIB_VERSION[0] ||
        stream_size != (int)(sizeof(z_stream)))
        return Z_VERSION_ERROR;
    if (strm == Z_NULL) return Z_STREAM_ERROR;
    strm->msg = Z_NULL;                 /* in case we return an error */
    if (strm->zalloc == (alloc_func)0) {
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
    }
    if (strm->zfree == (free_func)0) strm->zfree = zcfree;
    state = (struct inflate_state FAR *)
            ZALLOC(strm, 1, sizeof(struct inflate_state));
    if (state == Z_NULL) return Z_MEM_ERROR;
    Tracev((stderr, "inflate: allocated\n"));
    strm->state = (struct internal_state FAR *)state;
    if (windowBits < 0) {
        state->wrap = 0;
        windowBits = -windowBits;
    }
    else {
        state->wrap = (windowBits >> 4) + 1;
#ifdef GUNZIP
        if (windowBits < 48) windowBits &= 15;
#endif
    }
    if (windowBits < 8 || windowBits > 15) {
        ZFREE(strm, state);
        strm->state = Z_NULL;
        return Z_STREAM_ERROR;
    }
    state->wbits = (unsigned)windowBits;
    state->window = Z_NULL;
    return inflateReset(strm);
}